

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

void IR::Opnd::GetAddrDescription
               (char16 *description,size_t count,void *address,AddrOpndKind addressKind,
               bool AsmDumpMode,bool printToConsole,Func *func,bool skipMaskedAddress)

{
  Type TVar1;
  code *pcVar2;
  CodeGenWorkItemType CVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar7;
  JavascriptFunction *pJVar8;
  size_t sVar9;
  void *pvVar10;
  RecyclableObject *pRVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  JavascriptBoolean *pJVar12;
  JavascriptString *pJVar13;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  LPVOID pvVar14;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar15;
  char16_t *pcVar16;
  FrameDisplay *frameDisplay;
  char16_t *pcVar17;
  TypeId *pTVar18;
  double dVar19;
  char16 *local_38;
  char16 *buffer;
  size_t n;
  
  local_38 = description;
  buffer = (char16 *)count;
  if (address == (void *)0x0) {
    pcVar16 = L"(NULL)";
    goto LAB_00622455;
  }
  switch(addressKind) {
  case AddrOpndKindConstantAddress:
    pcVar16 = L"0x%012I64X";
    goto LAB_006229cd;
  case AddrOpndKindConstantVar:
    pcVar16 = L"";
    if ((undefined1 *)address == &DAT_fffc000000000000) {
      pcVar16 = L" (FloatTag)";
    }
    pcVar17 = L" (MissingItem)";
    if ((undefined1 *)address != &DAT_40002fff80002) {
      pcVar17 = pcVar16;
    }
    WriteToBuffer(&local_38,(size_t *)&buffer,L"0x%012I64X%s",address,pcVar17);
    return;
  case AddrOpndKindDynamicScriptContext:
    if ((func != (Func *)0x0) &&
       (iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x20])(),
       (void *)CONCAT44(extraout_var,iVar6) != address)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                         ,0xe64,
                         "(func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetAddr())"
                         ,
                         "func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetAddr()"
                        );
      if (!bVar4) {
LAB_00622da3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (ScriptContext)";
    break;
  case AddrOpndKindDynamicVtable:
    if ((undefined1 *)address == &DAT_00000001) {
      pcVar16 = L"%d (Invalid Vtable)";
      address = &DAT_00000001;
    }
    else {
      DumpAddress(address,printToConsole,skipMaskedAddress);
      address = Func::GetVtableName(func,(INT_PTR)address);
      pcVar16 = L" (%S Vtable)";
    }
    goto LAB_006229cd;
  case AddrOpndKindDynamicCharStringCache:
    if ((func != (Func *)0x0) &&
       (iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x11])(),
       (void *)CONCAT44(extraout_var_00,iVar6) != address)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                         ,0xe6a,
                         "(func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetCharStringCacheAddr())"
                         ,
                         "func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetCharStringCacheAddr()"
                        );
      if (!bVar4) goto LAB_00622da3;
      *puVar7 = 0;
    }
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (CharStringCache)";
    break;
  default:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pvVar10 = (void *)ThreadContextInfo::GetNullFrameDisplayAddr(func->m_threadContextInfo);
    if (pvVar10 == address) {
      pcVar16 = L" (NullFrameDisplay)";
    }
    else {
      pvVar10 = (void *)ThreadContextInfo::GetStrictNullFrameDisplayAddr(func->m_threadContextInfo);
      if (pvVar10 == address) {
        pcVar16 = L" (StrictNullFrameDisplay)";
      }
      else {
        iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x1b])();
        if ((void *)CONCAT44(extraout_var_01,iVar6) == address) {
          pcVar16 = L" (NumberAllocator)";
        }
        else {
          iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x1c])();
          if ((void *)CONCAT44(extraout_var_02,iVar6) == address) {
            pcVar16 = L" (Recycler)";
          }
          else {
            CVar3 = JITTimeWorkItem::Type(func->m_workItem);
            if ((CVar3 == JsFunctionType) &&
               (pvVar10 = (void *)JITTimeWorkItem::GetCallsCountAddress(func->m_workItem),
               pvVar10 == address)) {
              pcVar16 = L" (&CallCount)";
            }
            else {
              iVar6 = (*func->m_threadContextInfo->_vptr_ThreadContextInfo[5])();
              if ((void *)CONCAT44(extraout_var_03,iVar6) == address) {
                pcVar16 = L" (&ImplicitCallFlags)";
              }
              else {
                iVar6 = (*func->m_threadContextInfo->_vptr_ThreadContextInfo[4])();
                if ((void *)CONCAT44(extraout_var_05,iVar6) == address) {
                  pcVar16 = L" (&DisableImplicitCallFlags)";
                }
                else {
                  iVar6 = (*func->m_threadContextInfo->_vptr_ThreadContextInfo[3])();
                  if ((void *)CONCAT44(extraout_var_06,iVar6) == address) {
                    pcVar16 = L" (&StackLimit)";
                  }
                  else {
                    bVar4 = Func::CanAllocInPreReservedHeapPageSegment(func);
                    if (bVar4) {
                      pTVar18 = func->m_threadContextInfo[-3].wellKnownHostTypeIds;
                      if (func->m_threadContextInfo == (ThreadContextInfo *)0x0) {
                        pTVar18 = (TypeId *)0x0;
                      }
                      bVar4 = Memory::PreReservedVirtualAllocWrapper::IsPreReservedRegionPresent
                                        ((PreReservedVirtualAllocWrapper *)(pTVar18 + 0x4a));
                      if ((bVar4) &&
                         (pvVar14 = Memory::PreReservedVirtualAllocWrapper::GetPreReservedEndAddress
                                              ((PreReservedVirtualAllocWrapper *)(pTVar18 + 0x4a)),
                         pvVar14 == address)) {
                        pcVar16 = L" (PreReservedCodeSegmentEnd)";
                        break;
                      }
                    }
                    iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x12])();
                    if ((void *)CONCAT44(extraout_var_07,iVar6) == address) {
                      pcVar16 = L" (&OptimizationOverrides_SideEffects)";
                    }
                    else {
                      iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x13])();
                      if ((void *)CONCAT44(extraout_var_08,iVar6) == address) {
                        pcVar16 = L" (&OptimizationOverrides_ArraySetElementFastPathVtable)";
                      }
                      else {
                        iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x14])();
                        if ((void *)CONCAT44(extraout_var_09,iVar6) == address) {
                          pcVar16 = L" (&OptimizationOverrides_IntArraySetElementFastPathVtable)";
                        }
                        else {
                          iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x15])();
                          if ((void *)CONCAT44(extraout_var_10,iVar6) == address) {
                            pcVar16 = 
                            L" (&OptimizationOverrides_FloatArraySetElementFastPathVtable)";
                          }
                          else {
                            pcVar16 = L" (Unknown)";
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case AddrOpndKindDynamicFunctionBody:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    address = *(void **)((long)address + 0x10);
    goto LAB_0062276b;
  case AddrOpndKindDynamicFunctionInfo:
    DumpAddress(address,printToConsole,skipMaskedAddress);
LAB_0062276b:
    pcVar16 = (char16 *)0x0;
LAB_0062297e:
    DumpFunctionInfo(&local_38,(size_t *)&buffer,(FunctionInfo *)address,false,pcVar16);
    return;
  case AddrOpndKindDynamicInlineCache:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (InlineCache)";
    break;
  case AddrOpndKindDynamicBailOutRecord:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (BailOutRecord)";
    break;
  case AddrOpndKindDynamicVar:
    bVar4 = Js::TaggedInt::Is(address);
    if (bVar4) {
      uVar5 = Js::TaggedInt::ToInt32(address);
      WriteToBuffer(&local_38,(size_t *)&buffer,L"0x%012I64X (value: %d)",address,(ulong)uVar5);
      return;
    }
    if ((ulong)address >> 0x32 != 0) {
switchD_00622b24_caseD_4:
      dVar19 = Js::JavascriptNumber::GetValue(address);
      pcVar16 = L" (value: %f)";
      goto LAB_00622a73;
    }
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pRVar11 = Js::VarTo<Js::RecyclableObject>(address);
    TVar1 = ((pRVar11->type).ptr)->typeId;
    if ((int)TVar1 < 0x19) {
      switch(TVar1) {
      case TypeIds_Undefined:
        pcVar16 = L" (undefined)";
        break;
      case TypeIds_Null:
        pcVar16 = L" (null)";
        break;
      case TypeIds_Boolean:
        pJVar12 = Js::VarTo<Js::JavascriptBoolean>(address);
        pcVar16 = L" (true)";
        if (pJVar12->value == 0) {
          pcVar16 = L" (false)";
        }
        break;
      default:
        goto switchD_00622b24_caseD_3;
      case TypeIds_Number:
        goto switchD_00622b24_caseD_4;
      case TypeIds_String:
        pJVar13 = Js::VarTo<Js::JavascriptString>(address);
        iVar6 = (*(pJVar13->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar13);
        address = (void *)CONCAT44(extraout_var_04,iVar6);
        pcVar16 = L" (\"%s\")";
        goto LAB_006229cd;
      }
    }
    else {
      if (TVar1 == TypeIds_LastStaticType) {
        pcVar16 = L" (UndeclBlockVar)";
        break;
      }
      if (TVar1 == TypeIds_Function) {
        address = *(void **)((long)address + 0x28);
        pcVar16 = L"FunctionObject";
        goto LAB_0062297e;
      }
      if (TVar1 == TypeIds_GlobalObject) {
        pcVar16 = L" (GlobalObject)";
        break;
      }
switchD_00622b24_caseD_3:
      pcVar16 = L" (DynamicObject)";
    }
    break;
  case AddrOpndKindDynamicType:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    uVar5 = *address;
    uVar15 = (ulong)uVar5;
    switch(uVar5) {
    case 0x1c:
      pcVar16 = L" (Type: Object)";
      break;
    case 0x1d:
      pcVar16 = L" (Type: Array)";
      break;
    case 0x1e:
      pcVar16 = L" (Type: NativeIntArray)";
      break;
    case 0x20:
      pcVar16 = L" (Type: NativeFltArray)";
      break;
    case 0x23:
      pcVar16 = L" (Type: Regex)";
      break;
    default:
      if (uVar5 == 7) {
        pcVar16 = L" (Type: StaticString)";
        break;
      }
      if (uVar5 == 4) {
        pcVar16 = L" (Type: StaticNumber)";
        break;
      }
    case 0x1f:
    case 0x21:
    case 0x22:
      pcVar16 = L" (Type: Id %d)";
LAB_006225b9:
      WriteToBuffer(&local_38,(size_t *)&buffer,pcVar16,uVar15);
      return;
    }
    break;
  case AddrOpndKindDynamicTypeHandler:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (TypeHandler)";
    break;
  case AddrOpndKindDynamicFrameDisplay:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (FrameDisplay len %d)";
    if (*(char *)((long)address + 1) != '\0') {
      pcVar16 = L" (StrictFrameDisplay len %d)";
    }
    uVar15 = (ulong)*(ushort *)((long)address + 2);
    goto LAB_006225b9;
  case AddrOpndKindDynamicGuardValueRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&GuardValue)";
    break;
  case AddrOpndKindDynamicArrayCallSiteInfo:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (ArrayCallSiteInfo)";
    break;
  case AddrOpndKindDynamicFunctionBodyWeakRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    address = *(void **)(*address + 0x10);
    pcVar16 = L"FunctionBodyWeakRef";
    goto LAB_0062297e;
  case AddrOpndKindDynamicObjectTypeRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    bVar4 = Js::VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)((long)address + -8));
    if (bVar4) {
      pJVar8 = Js::VarTo<Js::JavascriptFunction>((RecyclableObject *)((long)address + -8));
      address = (pJVar8->functionInfo).ptr;
      pcVar16 = L"FunctionObjectTypeRef";
      goto LAB_0062297e;
    }
    pcVar16 = L" (ObjectTypeRef)";
    break;
  case AddrOpndKindDynamicTypeCheckGuard:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (TypeCheckGuard)";
    break;
  case AddrOpndKindDynamicRecyclerAllocatorEndAddressRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&RecyclerAllocatorEndAddress)";
    break;
  case AddrOpndKindDynamicRecyclerAllocatorFreeListRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&RecyclerAllocatorFreeList)";
    break;
  case AddrOpndKindDynamicBailOutKindRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&BailOutKind)";
    break;
  case AddrOpndKindDynamicAuxSlotArrayRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&AuxSlotArray)";
    break;
  case AddrOpndKindDynamicPropertySlotRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&PropertySlot)";
    break;
  case AddrOpndKindDynamicFunctionEnvironmentRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    address = *(void **)((long)address + -8);
    pcVar16 = L"ScriptFunctionEnvironmentRef";
    goto LAB_0062297e;
  case AddrOpndKindDynamicIsInstInlineCacheFunctionRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&IsInstInlineCache.function)";
    break;
  case AddrOpndKindDynamicIsInstInlineCacheTypeRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&IsInstInlineCache.type)";
    break;
  case AddrOpndKindDynamicIsInstInlineCacheResultRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&IsInstInlineCache.result)";
    break;
  case AddrOpndKindSz:
    sVar9 = PAL_wcslen((char16_t *)address);
    pcVar16 = L"\"%.30s\"";
    if (0x1e < sVar9) {
      pcVar16 = L"\"%.30s...\"";
    }
LAB_006229cd:
    WriteToBuffer(&local_38,(size_t *)&buffer,pcVar16,address);
    return;
  case AddrOpndKindDynamicFloatRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    dVar19 = (double)*address;
    pcVar16 = L" (&(float)%f)";
    goto LAB_00622a73;
  case AddrOpndKindDynamicDoubleRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    dVar19 = *address;
    pcVar16 = L" (&(double)%f)";
LAB_00622a73:
    WriteToBuffer(&local_38,(size_t *)&buffer,pcVar16,dVar19);
    return;
  case AddrOpndKindDynamicNativeCodeDataRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&NativeCodeData)";
    break;
  case AddrOpndKindDynamicAuxBufferRef:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (AuxBufferRef)";
    break;
  case AddrOpndKindForInCache:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (EnumeratorCache)";
    break;
  case AddrOpndKindForInCacheType:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&EnumeratorCache->type)";
    break;
  case AddrOpndKindForInCacheData:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&EnumeratorCache->data)";
    break;
  case AddrOpndKindWriteBarrierCardTable:
    DumpAddress(address,printToConsole,skipMaskedAddress);
    pcVar16 = L" (&WriteBarrierCardTable)";
  }
LAB_00622455:
  WriteToBuffer(&local_38,(size_t *)&buffer,pcVar16);
  return;
}

Assistant:

void
Opnd::GetAddrDescription(__out_ecount(count) char16 *const description, const size_t count,
    void * address, IR::AddrOpndKind addressKind, bool AsmDumpMode, bool printToConsole, Func *func, bool skipMaskedAddress)
{
    char16 *buffer = description;
    size_t n = count;

    if (address)
    {
        switch (addressKind)
        {
        case IR::AddrOpndKindConstantAddress:
        {
#ifdef TARGET_64
            char16 const * format = _u("0x%012I64X");
#else
            char16 const * format = _u("0x%08X");
#endif
            WriteToBuffer(&buffer, &n, format, address);
        }
        break;
        case IR::AddrOpndKindDynamicVar:
            if (Js::TaggedInt::Is(address))
            {
#ifdef TARGET_64
                char16 const * format = _u("0x%012I64X (value: %d)");
#else
                char16 const * format = _u("0x%08X  (value: %d)");
#endif
                WriteToBuffer(&buffer, &n, format, address, Js::TaggedInt::ToInt32(address));
            }
#if FLOATVAR
            else if (Js::JavascriptNumber::Is_NoTaggedIntCheck(address))
#else
            else if (!func->IsOOPJIT() && Js::JavascriptNumber::Is_NoTaggedIntCheck(address))
#endif
            {
                WriteToBuffer(&buffer, &n, _u(" (value: %f)"), Js::JavascriptNumber::GetValue(address));
            }
            else
            {
                DumpAddress(address, printToConsole, skipMaskedAddress);
                // TODO: michhol OOP JIT, fix dumping these
                if (func->IsOOPJIT())
                {
                    WriteToBuffer(&buffer, &n, _u(" (unknown)"));
                }
                else
                {
                    switch (Js::VarTo<Js::RecyclableObject>(address)->GetTypeId())
                    {
                    case Js::TypeIds_Boolean:
                        WriteToBuffer(&buffer, &n, Js::VarTo<Js::JavascriptBoolean>(address)->GetValue() ? _u(" (true)") : _u(" (false)"));
                        break;
                    case Js::TypeIds_String:
                        WriteToBuffer(&buffer, &n, _u(" (\"%s\")"), Js::VarTo<Js::JavascriptString>(address)->GetSz());
                        break;
                    case Js::TypeIds_Number:
                        WriteToBuffer(&buffer, &n, _u(" (value: %f)"), Js::JavascriptNumber::GetValue(address));
                        break;
                    case Js::TypeIds_Undefined:
                        WriteToBuffer(&buffer, &n, _u(" (undefined)"));
                        break;
                    case Js::TypeIds_Null:
                        WriteToBuffer(&buffer, &n, _u(" (null)"));
                        break;
                    case Js::TypeIds_GlobalObject:
                        WriteToBuffer(&buffer, &n, _u(" (GlobalObject)"));
                        break;
                    case Js::TypeIds_UndeclBlockVar:
                        WriteToBuffer(&buffer, &n, _u(" (UndeclBlockVar)"));
                        break;
                    case Js::TypeIds_Function:
                        DumpFunctionInfo(&buffer, &n, ((Js::JavascriptFunction *)address)->GetFunctionInfo(), printToConsole, _u("FunctionObject"));
                        break;
                    default:
                        WriteToBuffer(&buffer, &n, _u(" (DynamicObject)"));
                        break;
                    }
                }
            }
            break;
        case IR::AddrOpndKindConstantVar:
        {
#ifdef TARGET_64
            char16 const * format = _u("0x%012I64X%s");
#else
            char16 const * format = _u("0x%08X%s");
#endif
            char16 const * addressName = _u("");

            if (address == Js::JavascriptArray::MissingItem)
            {
                addressName = _u(" (MissingItem)");
            }
#if FLOATVAR
            else if (address == (Js::Var)Js::FloatTag_Value)
            {
                addressName = _u(" (FloatTag)");
            }
#endif
            WriteToBuffer(&buffer, &n, format, address, addressName);
            break;
        }
        case IR::AddrOpndKindDynamicScriptContext:
            Assert(func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetAddr());
            // The script context pointer is unstable allocated from the CRT
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (ScriptContext)"));
            break;
        case IR::AddrOpndKindDynamicCharStringCache:
            Assert(func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetCharStringCacheAddr());
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (CharStringCache)"));
            break;

        case IR::AddrOpndKindDynamicBailOutRecord:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (BailOutRecord)"));
            break;

        case IR::AddrOpndKindDynamicInlineCache:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (InlineCache)"));
            break;

        case IR::AddrOpndKindDynamicIsInstInlineCacheFunctionRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&IsInstInlineCache.function)"));
            break;

        case IR::AddrOpndKindDynamicIsInstInlineCacheTypeRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&IsInstInlineCache.type)"));
            break;

        case IR::AddrOpndKindDynamicIsInstInlineCacheResultRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&IsInstInlineCache.result)"));
            break;

        case AddrOpndKindDynamicGuardValueRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&GuardValue)"));
            break;

        case AddrOpndKindDynamicAuxSlotArrayRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&AuxSlotArray)"));
            break;

        case AddrOpndKindDynamicPropertySlotRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&PropertySlot)"));
            break;

        case AddrOpndKindDynamicBailOutKindRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&BailOutKind)"));
            break;

        case AddrOpndKindDynamicArrayCallSiteInfo:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (ArrayCallSiteInfo)"));
            break;

        case AddrOpndKindDynamicTypeCheckGuard:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (TypeCheckGuard)"));
            break;

        case AddrOpndKindDynamicRecyclerAllocatorEndAddressRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&RecyclerAllocatorEndAddress)"));
            break;

        case AddrOpndKindDynamicAuxBufferRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (AuxBufferRef)"));
            break;

        case AddrOpndKindDynamicRecyclerAllocatorFreeListRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&RecyclerAllocatorFreeList)"));
            break;

        case IR::AddrOpndKindDynamicFunctionInfo:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            if (func->IsOOPJIT())
            {
                // TODO: OOP JIT, dump more info
                WriteToBuffer(&buffer, &n, _u(" (FunctionInfo)"));
            }
            else
            {
                DumpFunctionInfo(&buffer, &n, (Js::FunctionInfo *)address, printToConsole);
            }
            break;

        case IR::AddrOpndKindDynamicFunctionBody:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            if (func->IsOOPJIT())
            {
                // TODO: OOP JIT, dump more info
                WriteToBuffer(&buffer, &n, _u(" (FunctionBody)"));
            }
            else
            {
                DumpFunctionInfo(&buffer, &n, ((Js::FunctionBody *)address)->GetFunctionInfo(), printToConsole);
            }
            break;

        case IR::AddrOpndKindDynamicFunctionBodyWeakRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);

            if (func->IsOOPJIT())
            {
                // TODO: OOP JIT, dump more info
                WriteToBuffer(&buffer, &n, _u(" (FunctionBodyWeakRef)"));
            }
            else
            {
                DumpFunctionInfo(&buffer, &n, ((RecyclerWeakReference<Js::FunctionBody> *)address)->FastGet()->GetFunctionInfo(), printToConsole, _u("FunctionBodyWeakRef"));
            }
            break;

        case IR::AddrOpndKindDynamicFunctionEnvironmentRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            DumpFunctionInfo(&buffer, &n, ((Js::ScriptFunction *)((intptr_t)address - Js::ScriptFunction::GetOffsetOfEnvironment()))->GetFunctionInfo(),
                printToConsole, _u("ScriptFunctionEnvironmentRef"));
            break;
        case IR::AddrOpndKindDynamicVtable:
            if ((INT_PTR)address == Js::ScriptContextOptimizationOverrideInfo::InvalidVtable)
            {
                WriteToBuffer(&buffer, &n, _u("%d (Invalid Vtable)"), Js::ScriptContextOptimizationOverrideInfo::InvalidVtable);
            }
            else
            {
                DumpAddress(address, printToConsole, skipMaskedAddress);
                WriteToBuffer(&buffer, &n, _u(" (%S Vtable)"), func->GetVtableName((INT_PTR)address));
            }
            break;

        case IR::AddrOpndKindDynamicTypeHandler:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (TypeHandler)"));
            break;

        case IR::AddrOpndKindDynamicObjectTypeRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            {
                Js::RecyclableObject * dynamicObject = (Js::RecyclableObject *)((intptr_t)address - Js::RecyclableObject::GetOffsetOfType());
                if (!func->IsOOPJIT() && Js::VarIs<Js::JavascriptFunction>(dynamicObject))
                {
                    DumpFunctionInfo(&buffer, &n, Js::VarTo<Js::JavascriptFunction>((void *)((intptr_t)address - Js::RecyclableObject::GetOffsetOfType()))->GetFunctionInfo(),
                        printToConsole, _u("FunctionObjectTypeRef"));
                }
                else
                {
                    // TODO: OOP JIT, dump more info
                    WriteToBuffer(&buffer, &n, _u(" (ObjectTypeRef)"));
                }
            }
            break;

        case IR::AddrOpndKindDynamicType:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            // TODO: OOP JIT, dump more info
            if(!func->IsOOPJIT())
            {
                Js::TypeId typeId = ((Js::Type*)address)->GetTypeId();
                switch (typeId)
                {
                case Js::TypeIds_Number:
                    WriteToBuffer(&buffer, &n, _u(" (Type: StaticNumber)"));
                    break;
                case Js::TypeIds_String:
                    WriteToBuffer(&buffer, &n, _u(" (Type: StaticString)"));
                    break;
                case Js::TypeIds_Object:
                    WriteToBuffer(&buffer, &n, _u(" (Type: Object)"));
                    break;
                case Js::TypeIds_RegEx:
                    WriteToBuffer(&buffer, &n, _u(" (Type: Regex)"));
                    break;
                case Js::TypeIds_Array:
                    WriteToBuffer(&buffer, &n, _u(" (Type: Array)"));
                    break;
                case Js::TypeIds_NativeIntArray:
                    WriteToBuffer(&buffer, &n, _u(" (Type: NativeIntArray)"));
                    break;
                case Js::TypeIds_NativeFloatArray:
                    WriteToBuffer(&buffer, &n, _u(" (Type: NativeFltArray)"));
                    break;
                default:
                    WriteToBuffer(&buffer, &n, _u(" (Type: Id %d)"), typeId);
                    break;
                }
            }
            break;

        case AddrOpndKindDynamicFrameDisplay:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            if (!func->IsOOPJIT())
            {
                Js::FrameDisplay * frameDisplay = (Js::FrameDisplay *)address;
                WriteToBuffer(&buffer, &n, (frameDisplay->GetStrictMode() ? _u(" (StrictFrameDisplay len %d)") : _u(" (FrameDisplay len %d)")),
                    frameDisplay->GetLength());
            }
            else
            {
                WriteToBuffer(&buffer, &n, _u(" (FrameDisplay)"));
            }
            break;
        case AddrOpndKindSz:
            WriteToBuffer(&buffer, &n, wcslen((char16 const *)address) > 30 ? _u("\"%.30s...\"") : _u("\"%.30s\""), address);
            break;
        case AddrOpndKindDynamicFloatRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&(float)%f)"), *(float *)address);
            break;
        case AddrOpndKindDynamicDoubleRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&(double)%f)"), *(double *)address);
            break;
        case AddrOpndKindForInCache:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (EnumeratorCache)"));
            break;
        case AddrOpndKindForInCacheType:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&EnumeratorCache->type)"));
            break;
        case AddrOpndKindForInCacheData:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&EnumeratorCache->data)"));
            break;
        case AddrOpndKindDynamicNativeCodeDataRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&NativeCodeData)"));
            break;
        case AddrOpndKindWriteBarrierCardTable:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&WriteBarrierCardTable)"));
            break;
        default:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            if ((intptr_t)address == func->GetThreadContextInfo()->GetNullFrameDisplayAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (NullFrameDisplay)"));
            }
            else if ((intptr_t)address == func->GetThreadContextInfo()->GetStrictNullFrameDisplayAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (StrictNullFrameDisplay)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetNumberAllocatorAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (NumberAllocator)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetRecyclerAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (Recycler)"));
            }
            else if (func->GetWorkItem()->Type() == JsFunctionType && (intptr_t)address == func->GetWorkItem()->GetCallsCountAddress())
            {
                WriteToBuffer(&buffer, &n, _u(" (&CallCount)"));
            }
            else if ((intptr_t)address == func->GetThreadContextInfo()->GetImplicitCallFlagsAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&ImplicitCallFlags)"));
            }
            else if ((intptr_t)address == func->GetThreadContextInfo()->GetDisableImplicitFlagsAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&DisableImplicitCallFlags)"));
            }
            else if ((intptr_t)address == func->GetThreadContextInfo()->GetThreadStackLimitAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&StackLimit)"));
            }
            else if (func->CanAllocInPreReservedHeapPageSegment() &&
#if ENABLE_OOP_NATIVE_CODEGEN
                (func->IsOOPJIT()
                    ? func->GetOOPThreadContext()->GetPreReservedSectionAllocator()->IsPreReservedEndAddress(address)
                    : func->GetInProcThreadContext()->GetPreReservedVirtualAllocator()->IsPreReservedEndAddress(address)
                )
#else
                func->GetInProcThreadContext()->GetPreReservedVirtualAllocator()->IsPreReservedEndAddress(address)
#endif
                )
            {
                WriteToBuffer(&buffer, &n, _u(" (PreReservedCodeSegmentEnd)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetSideEffectsAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&OptimizationOverrides_SideEffects)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetArraySetElementFastPathVtableAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&OptimizationOverrides_ArraySetElementFastPathVtable)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetIntArraySetElementFastPathVtableAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&OptimizationOverrides_IntArraySetElementFastPathVtable)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetFloatArraySetElementFastPathVtableAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&OptimizationOverrides_FloatArraySetElementFastPathVtable)"));
            }
            else
            {
                WriteToBuffer(&buffer, &n, _u(" (Unknown)"));
            }
        }
    }